

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::GetTriHostname
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aHostname)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  format_args args;
  string_view fmt;
  anon_class_1_0_00000001 local_122;
  v10 local_121;
  v10 *local_120;
  size_t local_118;
  string local_110;
  Error local_f0;
  undefined1 local_c1;
  string *local_c0;
  string *aHostname_local;
  CommissionerApp *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  Error **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  local_c1 = 0;
  local_c0 = aHostname;
  aHostname_local = (string *)this;
  this_local = (CommissionerApp *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  if (((this->mBbrDataset).mPresentFlags & 0x8000) == 0) {
    GetTriHostname::anon_class_1_0_00000001::operator()(&local_122);
    local_58 = &local_120;
    local_60 = &local_121;
    bVar1 = ::fmt::v10::operator()(local_60);
    local_118 = bVar1.size_;
    local_120 = (v10 *)bVar1.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_110;
    local_78 = local_120;
    sStack_70 = local_118;
    local_50 = &local_78;
    local_88 = local_120;
    local_80 = local_118;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_18 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_110,local_88,fmt,args);
    Error::Error(&local_f0,kNotFound,&local_110);
    Error::operator=(__return_storage_ptr__,&local_f0);
    Error::~Error(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
  }
  else {
    std::__cxx11::string::operator=((string *)local_c0,(string *)&this->mBbrDataset);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetTriHostname(std::string &aHostname) const
{
    Error error;

    VerifyOrExit(mBbrDataset.mPresentFlags & BbrDataset::kTriHostnameBit,
                 error = ERROR_NOT_FOUND("cannot find valid TRI Hostname in BBR Dataset"));
    aHostname = mBbrDataset.mTriHostname;

exit:
    return error;
}